

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall symbols::BuiltinFunction::~BuiltinFunction(BuiltinFunction *this)

{
  ~BuiltinFunction(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

BuiltinFunction(std::string name)
                :BuiltinObject(Types::BUILTINFUNCTION), func_name{name}{}